

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  ClipType CVar1;
  PolyFillType PVar2;
  PolyFillType PVar3;
  
  PVar3 = this->m_ClipFillType;
  PVar2 = this->m_SubjFillType;
  if (edge->polyType == ptSubject) {
    PVar3 = this->m_SubjFillType;
    PVar2 = this->m_ClipFillType;
  }
  if (PVar3 < pftPositive) {
    if ((edge->windCnt + 1U & 0xfffffffd) != 0) {
      return false;
    }
  }
  else if (PVar3 == pftPositive) {
    if (edge->windCnt != 1) {
      return false;
    }
  }
  else if (edge->windCnt != -1) {
    return false;
  }
  CVar1 = this->m_ClipType;
  if (CVar1 == ctDifference) {
    if (edge->polyType == ptSubject) goto LAB_0068577b;
  }
  else {
    if (CVar1 == ctUnion) {
LAB_0068577b:
      if (PVar2 < pftPositive) {
        return edge->windCnt2 == 0;
      }
      if (PVar2 != pftPositive) {
        return -1 < edge->windCnt2;
      }
      return edge->windCnt2 < 1;
    }
    if (CVar1 != ctIntersection) {
      return true;
    }
  }
  if (PVar2 < pftPositive) {
    return edge->windCnt2 != 0;
  }
  if (PVar2 != pftPositive) {
    return SUB41((uint)edge->windCnt2 >> 0x1f,0);
  }
  return 0 < edge->windCnt2;
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.polyType == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
    case pftNonZero:
      if (Abs(edge.windCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.windCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.windCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 != 0);
        case pftPositive: 
          return (edge.windCnt2 > 0);
        default: 
          return (edge.windCnt2 < 0);
      }
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.windCnt2 == 0);
        case pftPositive: 
          return (edge.windCnt2 <= 0);
        default: 
          return (edge.windCnt2 >= 0);
      }
    case ctDifference:
      if (edge.polyType == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 == 0);
          case pftPositive: 
            return (edge.windCnt2 <= 0);
          default: 
            return (edge.windCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.windCnt2 != 0);
          case pftPositive: 
            return (edge.windCnt2 > 0);
          default: 
            return (edge.windCnt2 < 0);
        }
    default:
      return true;
  }
}